

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot.c
# Opt level: O3

Spot * spot_dup(Spot *spot)

{
  byte bVar1;
  SPOTTYPE SVar2;
  uchar uVar3;
  Spot *pSVar4;
  Card **ppCVar5;
  Card *pCVar6;
  ulong uVar7;
  
  SVar2 = spot->type;
  uVar3 = spot->index;
  pSVar4 = (Spot *)malloc(0x10);
  pSVar4->type = SVar2;
  pSVar4->index = uVar3;
  bVar1 = spot->cardsCount;
  ppCVar5 = (Card **)malloc((ulong)((uint)bVar1 * 8));
  pSVar4->cards = ppCVar5;
  pSVar4->cardsCount = bVar1;
  if (bVar1 != 0) {
    uVar7 = 0;
    do {
      pCVar6 = card_dup(spot->cards[uVar7]);
      ppCVar5[uVar7] = pCVar6;
      uVar7 = uVar7 + 1;
    } while (uVar7 < spot->cardsCount);
  }
  return pSVar4;
}

Assistant:

Spot * spot_dup(Spot * spot)
{
	unsigned char i;
	Spot * dupSpot = spot_create(spot->type, spot->index);
	dupSpot->cards = (Card **)malloc(sizeof(Card *)*spot->cardsCount);
	dupSpot->cardsCount = spot->cardsCount;
	for(i=0;i<spot->cardsCount;i++)
	{
		dupSpot->cards[i] = card_dup(spot->cards[i]);
	}
	return dupSpot;
}